

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapinfo.cpp
# Opt level: O0

vector<ItemInfo,_std::allocator<ItemInfo>_> * __thiscall
MapInfo::getAllMapInfo
          (vector<ItemInfo,_std::allocator<ItemInfo>_> *__return_storage_ptr__,MapInfo *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  reference pIVar4;
  reference pDVar5;
  undefined1 local_134 [8];
  ItemInfo i_2;
  DeathInfo c;
  _Self local_100;
  iterator __end1_2;
  iterator __begin1_2;
  list<MapInfo::DeathInfo,_std::allocator<MapInfo::DeathInfo>_> *__range1_2;
  ItemInfo i_1;
  ItemInfo b;
  _Self local_a0;
  iterator __end1_1;
  iterator __begin1_1;
  list<ItemInfo,_std::allocator<ItemInfo>_> *__range1_1;
  undefined1 local_78 [8];
  ItemInfo i;
  ItemInfo w;
  iterator __end1;
  iterator __begin1;
  list<ItemInfo,_std::allocator<ItemInfo>_> *__range1;
  MapInfo *this_local;
  vector<ItemInfo,_std::allocator<ItemInfo>_> *res;
  
  std::vector<ItemInfo,_std::allocator<ItemInfo>_>::vector(__return_storage_ptr__);
  __end1 = std::__cxx11::list<ItemInfo,_std::allocator<ItemInfo>_>::begin(&this->wards);
  register0x00000000 = std::__cxx11::list<ItemInfo,_std::allocator<ItemInfo>_>::end(&this->wards);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&w.life), bVar3) {
    pIVar4 = std::_List_iterator<ItemInfo>::operator*(&__end1);
    local_78._0_4_ = pIVar4->id;
    local_78._4_4_ = pIVar4->owner;
    w._12_8_ = *(undefined8 *)&(pIVar4->velocity).y;
    w.pos.x = (float)((ulong)*(undefined8 *)&(pIVar4->pos).y >> 0x20);
    w.id = (int)(pIVar4->pos).x;
    w.owner = (int)(pIVar4->pos).y;
    i.pos.x = w.pos.x;
    i._12_8_ = w._12_8_ & 0xffffffff;
    i.id = w.id;
    i.owner = w.owner;
    unique0x100005d4 = local_78;
    std::vector<ItemInfo,_std::allocator<ItemInfo>_>::push_back
              (__return_storage_ptr__,(value_type *)local_78);
    std::_List_iterator<ItemInfo>::operator++(&__end1);
  }
  __end1_1 = std::__cxx11::list<ItemInfo,_std::allocator<ItemInfo>_>::begin(&this->bombs);
  local_a0._M_node =
       (_List_node_base *)std::__cxx11::list<ItemInfo,_std::allocator<ItemInfo>_>::end(&this->bombs)
  ;
  while (bVar3 = std::operator!=(&__end1_1,&local_a0), bVar3) {
    pIVar4 = std::_List_iterator<ItemInfo>::operator*(&__end1_1);
    __range1_2 = *(list<MapInfo::DeathInfo,_std::allocator<MapInfo::DeathInfo>_> **)pIVar4;
    i_1._12_8_ = *(undefined8 *)&(pIVar4->velocity).y;
    b.pos.x = (float)((ulong)*(undefined8 *)&(pIVar4->pos).y >> 0x20);
    b.owner = (int)(pIVar4->pos).y;
    i_1.pos.x = b.pos.x;
    i_1.id = (int)(pIVar4->pos).x;
    i_1.owner = b.owner;
    unique0x100005c4 = __range1_2;
    std::vector<ItemInfo,_std::allocator<ItemInfo>_>::push_back
              (__return_storage_ptr__,(value_type *)&__range1_2);
    std::_List_iterator<ItemInfo>::operator++(&__end1_1);
  }
  __end1_2 = std::__cxx11::list<MapInfo::DeathInfo,_std::allocator<MapInfo::DeathInfo>_>::begin
                       (&this->deaths);
  local_100._M_node =
       (_List_node_base *)
       std::__cxx11::list<MapInfo::DeathInfo,_std::allocator<MapInfo::DeathInfo>_>::end
                 (&this->deaths);
  while (bVar3 = std::operator!=(&__end1_2,&local_100), bVar3) {
    pDVar5 = std::_List_iterator<MapInfo::DeathInfo>::operator*(&__end1_2);
    uVar1 = pDVar5->id;
    uVar2 = (pDVar5->pos).x;
    c.id = (int)*(undefined8 *)&(pDVar5->pos).y;
    i_2.velocity.y = (float)uVar1;
    i_2.life = uVar2;
    ItemInfo::ItemInfo((ItemInfo *)local_134);
    local_134._0_4_ = i_2.velocity.y;
    i_2.owner = c.id;
    i_2.id = i_2.life;
    i_2.velocity.x = 2.8026e-45;
    std::vector<ItemInfo,_std::allocator<ItemInfo>_>::push_back
              (__return_storage_ptr__,(value_type *)local_134);
    std::_List_iterator<MapInfo::DeathInfo>::operator++(&__end1_2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ItemInfo> MapInfo::getAllMapInfo()
{
    vector<ItemInfo> res;
    //Use life as the type
    for (auto w : wards)
    {
        ItemInfo i = w;
        i.life = 0;
        res.push_back(i);
    }
    for (auto b : bombs)
    {
        ItemInfo i = b;
        b.life = 1;
        res.push_back(i);
    }
    for (auto c : deaths)
    {
        ItemInfo i;
        i.id = c.id;
        i.pos = c.pos;
        i.life = 2;
        res.push_back(i);
    }
    return res;
}